

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::ExceptionTranslatorRegistry::tryTranslators_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  pointer ppIVar1;
  iterator __position;
  string *psVar2;
  string *extraout_RAX;
  
  ppIVar1 = (this->m_translators).
            super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar1 !=
      (this->m_translators).
      super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (*(*ppIVar1)->_vptr_IExceptionTranslator[2])(__return_storage_ptr__,*ppIVar1,ppIVar1 + 1);
    return __return_storage_ptr__;
  }
  __cxa_rethrow();
  __position._M_current = (IExceptionTranslator **)__return_storage_ptr__->_M_string_length;
  if (__position._M_current !=
      (IExceptionTranslator **)(__return_storage_ptr__->field_2)._M_allocated_capacity) {
    psVar2 = (string *)(this->super_IExceptionTranslatorRegistry)._vptr_IExceptionTranslatorRegistry
    ;
    *__position._M_current = (IExceptionTranslator *)psVar2;
    __return_storage_ptr__->_M_string_length = __return_storage_ptr__->_M_string_length + 8;
    return psVar2;
  }
  std::vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>
  ::_M_realloc_insert<Catch::IExceptionTranslator_const*const&>
            ((vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>
              *)__return_storage_ptr__,__position,(IExceptionTranslator **)this);
  return extraout_RAX;
}

Assistant:

std::string tryTranslators() const {
            if( m_translators.empty() )
                throw;
            else
                return m_translators[0]->translate( m_translators.begin()+1, m_translators.end() );
        }